

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
exponential_search_upper_bound<int>
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int m,int *key)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int size_1;
  int size;
  int r;
  int l;
  int bound;
  byte local_8d;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int *local_60;
  int local_54;
  int *local_48;
  int *local_40;
  int *local_28;
  int *local_18;
  int *local_10;
  
  local_64 = 1;
  local_28 = (int *)(*(long *)(in_RDI + 0x48) + (long)in_ESI * 4);
  local_60 = in_RDX;
  local_54 = in_ESI;
  bVar1 = AlexCompare::operator()(*(AlexCompare **)(in_RDI + 0x28),in_RDX,local_28);
  if (bVar1) {
    local_70 = local_54;
    while( true ) {
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
      if (local_64 < local_70) {
        local_40 = (int *)(*(long *)(in_RDI + 0x48) + (long)(local_54 - local_64) * 4);
        local_48 = local_60;
        bVar1 = AlexCompare::operator()(*(AlexCompare **)(in_RDI + 0x28),local_60,local_40);
        in_stack_ffffffffffffff7c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c);
      }
      iVar2 = local_54;
      if ((char)(in_stack_ffffffffffffff7c >> 0x18) == '\0') break;
      local_64 = local_64 << 1;
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
    }
    piVar3 = std::min<int>(&local_64,&local_70);
    local_68 = iVar2 - *piVar3;
    local_6c = local_54 - local_64 / 2;
  }
  else {
    in_stack_ffffffffffffff8c = *(int *)(in_RDI + 0x58) - local_54;
    while( true ) {
      local_8d = 0;
      if (local_64 < in_stack_ffffffffffffff8c) {
        local_10 = (int *)(*(long *)(in_RDI + 0x48) + (long)(local_54 + local_64) * 4);
        local_18 = local_60;
        bVar1 = AlexCompare::operator()(*(AlexCompare **)(in_RDI + 0x28),local_60,local_10);
        local_8d = bVar1 ^ 0xff;
      }
      if ((local_8d & 1) == 0) break;
      local_64 = local_64 << 1;
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
    }
    local_68 = local_54 + local_64 / 2;
    piVar3 = std::min<int>(&local_64,(int *)&stack0xffffffffffffff8c);
    local_6c = local_54 + *piVar3;
    local_54 = in_stack_ffffffffffffff78;
  }
  iVar2 = binary_search_upper_bound<int>
                    ((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                      *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (int *)CONCAT44(in_stack_ffffffffffffff7c,local_54));
  return iVar2;
}

Assistant:

inline int exponential_search_upper_bound(int m, const K& key) {
    // Continue doubling the bound until it contains the upper bound. Then use
    // binary search.
    int bound = 1;
    int l, r;  // will do binary search in range [l, r)
    if (key_greater(ALEX_DATA_NODE_KEY_AT(m), key)) {
      int size = m;
      while (bound < size &&
             key_greater(ALEX_DATA_NODE_KEY_AT(m - bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m - std::min<int>(bound, size);
      r = m - bound / 2;
    } else {
      int size = data_capacity_ - m;
      while (bound < size &&
             key_lessequal(ALEX_DATA_NODE_KEY_AT(m + bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m + bound / 2;
      r = m + std::min<int>(bound, size);
    }
    return binary_search_upper_bound(l, r, key);
  }